

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void write_account(short account_type)

{
  long lVar1;
  undefined8 uVar2;
  DebitAccount dac;
  Client client;
  ofstream outFile;
  ofstream outFileClient;
  Account local_4d0;
  Client local_4ac;
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::ofstream::ofstream(&local_230);
  local_4ac.bdate[8] = '\0';
  local_4ac.bdate[9] = '\0';
  local_4ac.bdate[0] = '\0';
  local_4ac.bdate[1] = '\0';
  local_4ac.bdate[2] = '\0';
  local_4ac.bdate[3] = '\0';
  local_4ac.bdate[4] = '\0';
  local_4ac.bdate[5] = '\0';
  local_4ac.bdate[6] = '\0';
  local_4ac.bdate[7] = '\0';
  std::ofstream::open((char *)&local_230,0x105822);
  Client::create_client(&local_4ac);
  std::ostream::write((char *)&local_230,(long)&local_4ac);
  std::ofstream::close();
  std::ofstream::ofstream(&local_430);
  switch(account_type) {
  case 1:
    local_4d0._vptr_Account = (_func_int **)&PTR_create_account_00107cf8;
    std::ofstream::open((char *)&local_430,0x10513d);
    Account::create_account(&local_4d0,account_type,local_4ac.id,local_4ac.client_class);
    std::ostream::write((char *)&local_430,(long)&local_4d0);
    std::ofstream::close();
    break;
  case 2:
    local_4d0._vptr_Account = (_func_int **)&PTR_create_account_00107cb8;
    std::ofstream::open((char *)&local_430,0x10513d);
    CreditAccount::create_account((CreditAccount *)&local_4d0,local_4ac.id,local_4ac.client_class);
    std::ostream::write((char *)&local_430,(long)&local_4d0);
    std::ofstream::close();
    break;
  case 3:
    local_4d0._vptr_Account = (_func_int **)&PTR_create_account_00107d38;
    std::ofstream::open((char *)&local_430,0x10513d);
    Account::create_account(&local_4d0,account_type,local_4ac.id,local_4ac.client_class);
    std::ostream::write((char *)&local_430,(long)&local_4d0);
    std::ofstream::close();
    break;
  case 4:
    local_4d0._vptr_Account = (_func_int **)&PTR_create_account_00107d78;
    std::ofstream::open((char *)&local_430,0x10513d);
    Account::create_account(&local_4d0,account_type,local_4ac.id,local_4ac.client_class);
    std::ostream::write((char *)&local_430,(long)&local_4d0);
    std::ofstream::close();
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrong choice",0xc);
  }
  uVar2 = __M_extract<bool>;
  lVar1 = _VTT;
  local_430 = _VTT;
  *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = __M_extract<bool>;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = lVar1;
  *(undefined8 *)(local_228 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void write_account(short account_type)
{
    /*!
     * It is a helper function that writes the proper account details both
     * into Client.dat and Account.dat
     */

    std::ofstream outFileClient;
    Client client;
    outFileClient.open("Client.dat", std::ios::binary|std::ios::app);
    client.create_client();
    outFileClient.write((char *) &client, sizeof(Client));
    outFileClient.close();

    std::ofstream outFile;
    switch (account_type) {
        case 1:
        {
            DebitAccount dac;
            outFile.open("Account.dat",std::ios::binary|std::ios::app);
            dac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &dac, sizeof(Account));
            outFile.close();
            break;
        }


        case 2: {
            CreditAccount cac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            cac.create_account(client.get_client_id(), client.get_client_class());
            outFile.write((char *) &cac, sizeof(Account));
            outFile.close();
            break;
        }
        case 3: {
            BusinessAccount bac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            bac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &bac, sizeof(Account));
            outFile.close();
            break;
        }
        case 4: {
            SavingAccount sac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            sac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &sac, sizeof(Account));
            outFile.close();
            break;
        }

        default :std::cout<<"wrong choice";

    }


}